

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

void expand_cache_path(char *path,char *dir,char *fn)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  size_t local_48;
  long l;
  char *endp;
  char *cp;
  char *fn_local;
  char *dir_local;
  char *path_local;
  
  cp = fn;
  fn_local = dir;
  dir_local = path;
  while (endp = strchr(fn_local,0x25), endp != (char *)0x0) {
    strncpy(dir_local,fn_local,(long)endp - (long)fn_local);
    dir_local = dir_local + ((long)endp - (long)fn_local);
    pcVar2 = endp + 1;
    if (endp[1] == 's') {
      endp = pcVar2;
      strcpy(dir_local,cp);
      sVar1 = strlen(cp);
      dir_local = dir_local + sVar1;
      sVar1 = strlen(cp);
      cp = cp + sVar1;
      endp = endp + 1;
    }
    else if ((*pcVar2 < '0') || ('9' < *pcVar2)) {
      pcVar3 = dir_local + 1;
      *dir_local = '%';
      endp = endp + 2;
      dir_local = dir_local + 2;
      *pcVar3 = *pcVar2;
    }
    else {
      endp = pcVar2;
      local_48 = strtol(pcVar2,(char **)&l,10);
      sVar1 = strlen(cp);
      if (sVar1 <= local_48) {
        local_48 = strlen(cp);
      }
      if (*(char *)l == 's') {
        strncpy(dir_local,cp,local_48);
        dir_local = dir_local + local_48;
        cp = cp + local_48;
        *dir_local = '\0';
        endp = (char *)l;
      }
      else {
        pcVar2 = dir_local + 1;
        *dir_local = '%';
        dir_local = dir_local + 2;
        *pcVar2 = *endp;
      }
      endp = endp + 1;
    }
    fn_local = endp;
  }
  strcpy(dir_local,fn_local);
  sVar1 = strlen(fn_local);
  pcVar2 = dir_local + sVar1;
  dir_local = pcVar2;
  if ((*cp != '\0') && (pcVar2[-1] != '/')) {
    dir_local = pcVar2 + 1;
    *pcVar2 = '/';
  }
  strcpy(dir_local,cp);
  return;
}

Assistant:

void expand_cache_path(char *path, char *dir, char *fn) {
    char *cp;

    while ((cp = strchr(dir, '%'))) {
	strncpy(path, dir, cp-dir);
	path += cp-dir;

	if (*++cp == 's') {
	    strcpy(path, fn);
	    path += strlen(fn);
	    fn += strlen(fn);
	    cp++;
	} else if (*cp >= '0' && *cp <= '9') {
	    char *endp;
	    long l;

	    l = strtol(cp, &endp, 10);
	    l = MIN(l, strlen(fn));
	    if (*endp == 's') {
		strncpy(path, fn, l);
		path += l;
		fn += l;
		*path = 0;
		cp = endp+1;
	    } else {
		*path++ = '%';
		*path++ = *cp++;
	    }
	} else {
	    *path++ = '%';
	    *path++ = *cp++;
	}
	dir = cp;
    }
    strcpy(path, dir);
    path += strlen(dir);
    if (*fn && path[-1] != '/')
	*path++ = '/';
    strcpy(path, fn);
}